

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O0

uint_least64_t anon_unknown.dwarf_b2e3::call_function(size_t n)

{
  ulong local_20;
  size_t i;
  uint_least64_t result;
  size_t n_local;
  
  i = 0;
  result = n;
  for (local_20 = 0; local_20 < result; local_20 = local_20 + 1) {
    i = function(0x14);
    fp::keep<unsigned_long&>(&i);
  }
  return i;
}

Assistant:

uint_least64_t call_function(size_t n)
{
  uint_least64_t result{0};

  for (size_t i = 0; i < n; ++i) {
    result = function(20);
    fp::keep(result); // avoid optimization
  }

  return result;
}